

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateLengthDelim
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  FieldDescriptor *this_00;
  EnumDescriptor *pEVar4;
  LogMessage *pLVar5;
  OneofDescriptor *pOVar6;
  long lVar7;
  Options *in_RCX;
  char *pcVar8;
  char *local_78;
  string enum_type;
  int local_34;
  
  bVar1 = FieldDescriptor::is_packable(field);
  TVar2 = FieldDescriptor::type(field);
  if (bVar1) {
    if ((TVar2 != TYPE_ENUM) || (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03')) {
      TVar2 = FieldDescriptor::type(field);
      enum_type._M_dataplus._M_p = DeclaredTypeMethodName(TVar2);
      Formatter::operator()
                (format,
                 "ptr = ::$proto_ns$::internal::Packed$1$Parser($msg$_internal_mutable_$name$(), ptr, ctx);\n"
                 ,(char **)&enum_type);
      return;
    }
    pEVar4 = FieldDescriptor::enum_type(field);
    QualifiedClassName_abi_cxx11_(&enum_type,(cpp *)pEVar4,(EnumDescriptor *)this->options_,in_RCX);
    TVar2 = FieldDescriptor::type(field);
    local_78 = DeclaredTypeMethodName(TVar2);
    local_34 = *(int *)(field + 4);
    Formatter::operator()
              (format,
               "ptr = ::$proto_ns$::internal::Packed$1$Parser<$unknown_fields_type$>($msg$_internal_mutable_$name$(), ptr, ctx, $2$_IsValid, &$msg$_internal_metadata_, $3$);\n"
               ,&local_78,&enum_type,&local_34);
    goto LAB_002e7840;
  }
  if (TVar2 == TYPE_BYTES) {
    bVar1 = false;
  }
  else {
    if (TVar2 == TYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(field);
      if (bVar1) {
        pDVar3 = FieldDescriptor::message_type(field);
        std::__cxx11::string::string((string *)&enum_type,"value",(allocator *)&local_78);
        this_00 = Descriptor::FindFieldByName(pDVar3,&enum_type);
        std::__cxx11::string::~string((string *)&enum_type);
        if (this_00 == (FieldDescriptor *)0x0) {
          in_RCX = (Options *)0x2f4;
          internal::LogMessage::LogMessage
                    ((LogMessage *)&enum_type,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                     ,0x2f4);
          pLVar5 = internal::LogMessage::operator<<((LogMessage *)&enum_type,"CHECK failed: val: ");
          internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar5);
          internal::LogMessage::~LogMessage((LogMessage *)&enum_type);
        }
        TVar2 = FieldDescriptor::type(this_00);
        if ((TVar2 != TYPE_ENUM) || (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03')) {
          Formatter::operator()<>(format,"ptr = ctx->ParseMessage(&$msg$$name$_, ptr);\n");
          return;
        }
        pEVar4 = FieldDescriptor::enum_type(this_00);
        QualifiedClassName_abi_cxx11_
                  (&enum_type,(cpp *)pEVar4,(EnumDescriptor *)this->options_,in_RCX);
        local_78 = (char *)CONCAT44(local_78._4_4_,*(undefined4 *)(field + 4));
        Formatter::operator()
                  (format,
                   "auto object = ::$proto_ns$::internal::InitEnumParseWrapper<$unknown_fields_type$>(&$msg$$name$_, $1$_IsValid, $2$, &$msg$_internal_metadata_);\nptr = ctx->ParseMessage(&object, ptr);\n"
                   ,&enum_type,(int *)&local_78);
      }
      else {
        bVar1 = IsLazy(field,this->options_,this->scc_analyzer_);
        if (bVar1) {
          pOVar6 = FieldDescriptor::real_containing_oneof(field);
          if (pOVar6 == (OneofDescriptor *)0x0) {
            bVar1 = HasHasbit(field);
            if (bVar1) {
              pcVar8 = 
              "_Internal::set_has_$name$(&$has_bits$);\nauto* lazy_field = &$msg$$name$_;\n";
            }
            else {
              pcVar8 = "auto* lazy_field = &$msg$$name$_;\n";
            }
            Formatter::operator()<>(format,pcVar8);
          }
          else {
            if (((byte)field[1] & 0x10) == 0) {
              lVar7 = 0;
            }
            else {
              lVar7 = *(long *)(field + 0x28);
            }
            Formatter::operator()
                      (format,
                       "if (!$msg$_internal_has_$name$()) {\n  $msg$clear_$1$();\n  $msg$$1$_.$name$_ = ::$proto_ns$::Arena::CreateMessage<\n      ::$proto_ns$::internal::LazyField>($msg$GetArenaForAllocation());\n  $msg$set_has_$name$();\n}\nauto* lazy_field = $msg$$1$_.$name$_;\n"
                       ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         (lVar7 + 8));
          }
          FieldMessageTypeName_abi_cxx11_
                    (&enum_type,(cpp *)field,(FieldDescriptor *)this->options_,in_RCX);
          Formatter::operator()
                    (format,
                     "::$proto_ns$::internal::LazyFieldParseHelper<\n  ::$proto_ns$::internal::LazyField> parse_helper(\n    $1$::default_instance(),\n    $msg$GetArenaForAllocation(), lazy_field);\nptr = ctx->ParseMessage(&parse_helper, ptr);\n"
                     ,&enum_type);
        }
        else {
          bVar1 = IsImplicitWeakField(field,this->options_,this->scc_analyzer_);
          if (bVar1) {
            if ((~(byte)field[1] & 0x60) != 0) {
              pcVar8 = "ptr = ctx->ParseMessage(_Internal::mutable_$name$($this$), ptr);\n";
LAB_002e77f5:
              Formatter::operator()<>(format,pcVar8);
              return;
            }
            pDVar3 = FieldDescriptor::message_type(field);
            QualifiedDefaultInstanceName_abi_cxx11_
                      (&enum_type,(cpp *)pDVar3,(Descriptor *)this->options_,in_RCX);
            Formatter::operator()
                      (format,
                       "ptr = ctx->ParseMessage($msg$$name$_.AddWeak(reinterpret_cast<const ::$proto_ns$::MessageLite*>($1$ptr_)), ptr);\n"
                       ,&enum_type);
          }
          else {
            bVar1 = IsWeak(field,this->options_);
            if (!bVar1) {
              pcVar8 = "ptr = ctx->ParseMessage($msg$_internal_$mutable_field$(), ptr);\n";
              goto LAB_002e77f5;
            }
            pDVar3 = FieldDescriptor::message_type(field);
            QualifiedDefaultInstanceName_abi_cxx11_
                      (&enum_type,(cpp *)pDVar3,(Descriptor *)this->options_,in_RCX);
            local_78 = (char *)CONCAT44(local_78._4_4_,*(undefined4 *)(field + 4));
            Formatter::operator()
                      (format,
                       "{\n  auto* default_ = &reinterpret_cast<const Message&>($1$);\n  ptr = ctx->ParseMessage($msg$_weak_field_map_.MutableMessage($2$, default_), ptr);\n}\n"
                       ,&enum_type,(int *)&local_78);
          }
        }
      }
LAB_002e7840:
      std::__cxx11::string::~string((string *)&enum_type);
      return;
    }
    if (TVar2 != TYPE_STRING) {
      internal::LogMessage::LogMessage
                ((LogMessage *)&enum_type,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
                 ,0x339);
      pLVar5 = internal::LogMessage::operator<<
                         ((LogMessage *)&enum_type,
                          "Illegal combination for length delimited wiretype ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5," filed type is ");
      TVar2 = FieldDescriptor::type(field);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,TVar2);
      internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)&enum_type);
      return;
    }
    bVar1 = true;
  }
  GenerateStrings(this,format,field,bVar1);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateLengthDelim(Formatter& format,
                                                 const FieldDescriptor* field) {
  if (field->is_packable()) {
    if (field->type() == FieldDescriptor::TYPE_ENUM &&
        !HasPreservingUnknownEnumSemantics(field)) {
      std::string enum_type = QualifiedClassName(field->enum_type(), options_);
      format(
          "ptr = "
          "::$proto_ns$::internal::Packed$1$Parser<$unknown_fields_type$>("
          "$msg$_internal_mutable_$name$(), ptr, ctx, $2$_IsValid, "
          "&$msg$_internal_metadata_, $3$);\n",
          DeclaredTypeMethodName(field->type()), enum_type, field->number());
    } else {
      format(
          "ptr = ::$proto_ns$::internal::Packed$1$Parser("
          "$msg$_internal_mutable_$name$(), ptr, ctx);\n",
          DeclaredTypeMethodName(field->type()));
    }
  } else {
    auto field_type = field->type();
    switch (field_type) {
      case FieldDescriptor::TYPE_STRING:
        GenerateStrings(format, field, true /* utf8 */);
        break;
      case FieldDescriptor::TYPE_BYTES:
        GenerateStrings(format, field, false /* utf8 */);
        break;
      case FieldDescriptor::TYPE_MESSAGE: {
        if (field->is_map()) {
          const FieldDescriptor* val =
              field->message_type()->FindFieldByName("value");
          GOOGLE_CHECK(val);
          if (val->type() == FieldDescriptor::TYPE_ENUM &&
              !HasPreservingUnknownEnumSemantics(field)) {
            format(
                "auto object = "
                "::$proto_ns$::internal::InitEnumParseWrapper<"
                "$unknown_fields_type$>(&$msg$$name$_, $1$_IsValid, "
                "$2$, &$msg$_internal_metadata_);\n"
                "ptr = ctx->ParseMessage(&object, ptr);\n",
                QualifiedClassName(val->enum_type(), options_),
                field->number());
          } else {
            format("ptr = ctx->ParseMessage(&$msg$$name$_, ptr);\n");
          }
        } else if (IsLazy(field, options_, scc_analyzer_)) {
          if (field->real_containing_oneof()) {
            format(
                "if (!$msg$_internal_has_$name$()) {\n"
                "  $msg$clear_$1$();\n"
                "  $msg$$1$_.$name$_ = ::$proto_ns$::Arena::CreateMessage<\n"
                "      ::$proto_ns$::internal::LazyField>("
                "$msg$GetArenaForAllocation());\n"
                "  $msg$set_has_$name$();\n"
                "}\n"
                "auto* lazy_field = $msg$$1$_.$name$_;\n",
                field->containing_oneof()->name());
          } else if (HasHasbit(field)) {
            format(
                "_Internal::set_has_$name$(&$has_bits$);\n"
                "auto* lazy_field = &$msg$$name$_;\n");
          } else {
            format("auto* lazy_field = &$msg$$name$_;\n");
          }
          format(
              "::$proto_ns$::internal::LazyFieldParseHelper<\n"
              "  ::$proto_ns$::internal::LazyField> parse_helper(\n"
              "    $1$::default_instance(),\n"
              "    $msg$GetArenaForAllocation(), lazy_field);\n"
              "ptr = ctx->ParseMessage(&parse_helper, ptr);\n",
              FieldMessageTypeName(field, options_));
        } else if (IsImplicitWeakField(field, options_, scc_analyzer_)) {
          if (!field->is_repeated()) {
            format(
                "ptr = ctx->ParseMessage(_Internal::mutable_$name$($this$), "
                "ptr);\n");
          } else {
            format(
                "ptr = ctx->ParseMessage($msg$$name$_.AddWeak("
                "reinterpret_cast<const ::$proto_ns$::MessageLite*>($1$ptr_)"
                "), ptr);\n",
                QualifiedDefaultInstanceName(field->message_type(), options_));
          }
        } else if (IsWeak(field, options_)) {
          format(
              "{\n"
              "  auto* default_ = &reinterpret_cast<const Message&>($1$);\n"
              "  ptr = ctx->ParseMessage($msg$_weak_field_map_.MutableMessage("
              "$2$, default_), ptr);\n"
              "}\n",
              QualifiedDefaultInstanceName(field->message_type(), options_),
              field->number());
        } else {
          format(
              "ptr = ctx->ParseMessage($msg$_internal_$mutable_field$(), "
              "ptr);\n");
        }
        break;
      }
      default:
        GOOGLE_LOG(FATAL) << "Illegal combination for length delimited wiretype "
                   << " filed type is " << field->type();
    }
  }
}